

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O2

maybe<rangeless::fn::impl::X> __thiscall
rangeless::fn::impl::to_seq::
gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>::operator()
          (gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_> *this)

{
  int *piVar1;
  int *piVar2;
  undefined8 *in_RSI;
  
  if (*(char *)(in_RSI + 4) == '\0') {
    *(undefined1 *)(in_RSI + 4) = 1;
    piVar1 = (int *)*in_RSI;
    piVar2 = (int *)in_RSI[1];
  }
  else {
    piVar2 = (int *)in_RSI[1];
    piVar1 = (int *)in_RSI[3];
    if (piVar1 == piVar2) goto LAB_00175b84;
    piVar1 = piVar1 + 1;
  }
  in_RSI[3] = piVar1;
LAB_00175b84:
  if (piVar1 == piVar2) {
    *(undefined1 *)
     ((long)&(this->inps).
             super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>.
             _M_impl.super__Vector_impl_data._M_start + 4) = 1;
  }
  else {
    maybe<rangeless::fn::impl::X>::maybe((maybe<rangeless::fn::impl::X> *)this,(X)*piVar1);
  }
  return (maybe<rangeless::fn::impl::X>)this;
}

Assistant:

auto operator()() -> maybe<value_type>
            {
                if(!started) {
                    started = true;
                    it = inps.begin(); 
                        // r might not be a container (i.e. some input-range
                        // and begin()  may be non-const, so deferring until
                        // the first call to operator() rather than
                        // initializing it{ r.begin() } in constructor.
                } else if(it == inps.end()) {
                    ; // may be equal to end in case of repeated calls to operator() after ended
                } else {
                    ++it;
                }

                if(it == inps.end()) {
                    return { };
                } else {
                    return { std::move(*it) };
                }
            }